

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spell.cpp
# Opt level: O3

void Handlers::Spell_Target_Other(Character *character,PacketReader *reader)

{
  byte bVar1;
  int iVar2;
  World *pWVar3;
  uchar uVar4;
  bool bVar5;
  unsigned_short uVar6;
  uint uVar7;
  SpellTarget SVar8;
  mapped_type *this;
  ESF_Data *pEVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  key_type local_48;
  
  uVar4 = PacketReader::GetChar(reader);
  PacketReader::GetChar(reader);
  PacketReader::GetShort(reader);
  PacketReader::GetShort(reader);
  uVar6 = PacketReader::GetShort(reader);
  uVar7 = PacketReader::GetThree(reader);
  if ((character->spell_event == (TimeEvent *)0x0) && (character->spell_ready != true)) {
    return;
  }
  if (uVar4 == '\x01') {
    SVar8 = TargetPlayer;
  }
  else {
    if (uVar4 != '\x02') {
      Character::CancelSpell(character);
      return;
    }
    SVar8 = TargetNPC;
  }
  character->spell_target = SVar8;
  character->spell_target_id = uVar6;
  pWVar3 = character->world;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EnforceTimestamps","");
  this = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&pWVar3->config,&local_48);
  bVar5 = util::variant::GetBool(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar11 = (int)uVar7 % 0x83d600;
  if (bVar5) {
    pEVar9 = ESF::Get(character->world->esf,(uint)character->spell_id);
    iVar2 = (character->timestamp).ts;
    if (iVar11 == -1) {
      bVar1 = pEVar9->cast_time;
      iVar10 = iVar2;
      if ((int)((uint)bVar1 * 0x2f + -0xc) <= iVar2) goto LAB_001b1587;
    }
    else {
      iVar10 = (iVar11 - iVar2) + 0x83d600;
      if (iVar2 <= iVar11) {
        iVar10 = iVar11 - iVar2;
      }
      iVar12 = iVar10;
      if (iVar2 == -1) {
        iVar12 = iVar11;
      }
      bVar1 = pEVar9->cast_time;
      if ((int)((uint)bVar1 * 0x2f + -0xc) <= iVar12) {
        if (iVar2 == -1) {
          iVar10 = iVar11;
        }
LAB_001b1587:
        if (iVar10 <= (int)(((uint)bVar1 + (uint)(bVar1 == 0)) * 0x32)) goto LAB_001b159e;
      }
    }
    Character::CancelSpell(character);
  }
  else {
LAB_001b159e:
    (character->timestamp).ts = iVar11;
    if (character->spell_ready == true) {
      Character::SpellAct(character);
    }
  }
  return;
}

Assistant:

void Spell_Target_Other(Character *character, PacketReader &reader)
	{
		unsigned char target_type = reader.GetChar();
		reader.GetChar();
		reader.GetShort();
		/*unsigned short spell_id = */ reader.GetShort();
		unsigned short victim_id = reader.GetShort();
		Timestamp timestamp = reader.GetThree();

		if (!character->spell_event && !character->spell_ready)
			return;

		switch (target_type)
		{
		case 1:
			character->spell_target = Character::TargetPlayer;
			character->spell_target_id = victim_id;
			break;

		case 2:
			character->spell_target = Character::TargetNPC;
			character->spell_target_id = victim_id;
			break;

		default:
			character->CancelSpell();
			return;
		}

		if (character->world->config["EnforceTimestamps"])
		{
			const ESF_Data &spell = character->world->esf->Get(character->spell_id);

			if (timestamp - character->timestamp < (spell.cast_time - 1) * 47 + 35 || timestamp - character->timestamp > std::max<int>(spell.cast_time, 1) * 50)
			{
				character->CancelSpell();
				return;
			}
		}

		character->timestamp = timestamp;

		if (character->spell_ready)
			character->SpellAct();
	}